

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O2

string * hashStr2(string *__return_storage_ptr__,string *param_1,uint16_t seed,size_t n1,size_t n2,
                 string *default_value,string *map_name,string *key_type,bool nonKeyLookups)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,
                 "    static inline uint32_t hash(const std::string& key, const uint32_t& coeff) noexcept{\n        uint32_t h = 0;\n\n        for(size_t i = 0; i < key.size(); i++)\n            h = h*coeff + key[i];\n\n        return h;\n    }\n};\n\nstd::string_view "
                 ,map_name);
  std::operator+(&local_110,&local_50,"::lookup(const ");
  std::operator+(&local_f0,&local_110,key_type);
  std::operator+(&local_d0,&local_f0,"& key) noexcept{\n    constexpr uint32_t s0 = ");
  std::__cxx11::to_string(&local_130,(uint)seed);
  std::operator+(&local_b0,&local_d0,&local_130);
  std::operator+(&local_90,&local_b0,";\n    const size_t h1 = hash(key, s0) & ");
  std::__cxx11::to_string(&local_150,n1);
  std::operator+(&local_70,&local_90,&local_150);
  std::operator+(&local_1b0,&local_70,
                 ";\n    const uint32_t& s1 = seeds[h1];\n    const size_t bin = hash(key, s1) & ");
  std::__cxx11::to_string(&local_170,n2);
  std::operator+(&local_190,&local_1b0,&local_170);
  std::operator+(__return_storage_ptr__,&local_190,";\n");
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_50);
  if (nonKeyLookups) {
    std::operator+(&local_1b0,
                   "    return checkBin(key, bin) ? std::string_view(&flat_vals[val_start[bin]], val_size[bin]) : \""
                   ,default_value);
    std::operator+(&local_190,&local_1b0,"\";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr2(const std::string&, uint16_t seed, size_t n1, size_t n2, const std::string& default_value, std::string map_name, std::string key_type, bool nonKeyLookups){
    std::string hash =
        "    static inline uint32_t hash(const std::string& key, const uint32_t& coeff) noexcept{\n"
        "        uint32_t h = 0;\n"
        "\n"
        "        for(size_t i = 0; i < key.size(); i++)\n"
        "            h = h*coeff + key[i];\n"
        "\n"
        "        return h;\n"
        "    }\n"
        "};\n"
        "\n"
        "std::string_view " + map_name + "::lookup(const " + key_type + "& key) noexcept{\n"
        "    constexpr uint32_t s0 = " + std::to_string(seed) + ";\n"
        "    const size_t h1 = hash(key, s0) & " + std::to_string(n1) + ";\n"
        "    const uint32_t& s1 = seeds[h1];\n"
        "    const size_t bin = hash(key, s1) & " + std::to_string(n2) + ";\n";
    if(nonKeyLookups) hash +=
        "    return checkBin(key, bin) ? std::string_view(&flat_vals[val_start[bin]], val_size[bin]) : \"" + default_value + "\";\n";
    else hash +=
        "    #ifndef NDEBUG\n"
        "    assert(checkBin(key, bin));\n"
        "    #endif\n\n"
        "    return std::string_view(&flat_vals[val_start[bin]], val_size[bin]);\n";

    hash += "}\n\n";

    return hash;
}